

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_bit_decoder.cc
# Opt level: O2

bool __thiscall draco::RAnsBitDecoder::DecodeNextBit(RAnsBitDecoder *this)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  
  uVar1 = this->prob_zero_;
  uVar3 = (this->ans_decoder_).state;
  if ((uVar3 < 0x1000) && (iVar5 = (this->ans_decoder_).buf_offset, 0 < iVar5)) {
    uVar4 = iVar5 - 1;
    (this->ans_decoder_).buf_offset = uVar4;
    uVar3 = uVar3 << 8 | (uint)(this->ans_decoder_).buf[uVar4];
  }
  bVar2 = -uVar1;
  uVar4 = uVar3 & 0xff;
  iVar5 = (uVar3 >> 8) * (uint)bVar2;
  uVar6 = iVar5 + uVar4;
  if (uVar4 >= bVar2) {
    uVar6 = (uVar3 - iVar5) - (uint)bVar2;
  }
  (this->ans_decoder_).state = uVar6;
  return uVar4 < bVar2;
}

Assistant:

bool RAnsBitDecoder::DecodeNextBit() {
  const uint8_t bit = rabs_read(&ans_decoder_, prob_zero_);
  return bit > 0;
}